

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

result_type time_plain<trng::yarn5s>(yarn5s *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  string res;
  string local_58;
  double local_38;
  
  lVar6 = std::chrono::_V2::system_clock::now();
  iVar1 = (r->P).a[0];
  iVar2 = (r->P).a[1];
  iVar3 = (r->P).a[2];
  iVar4 = (r->P).a[3];
  iVar5 = (r->P).a[4];
  uVar8 = (ulong)(uint)(r->S).r[0];
  iVar9 = 0;
  lVar14 = 0x1000000;
  iVar15 = (r->S).r[1];
  iVar13 = (r->S).r[2];
  iVar10 = (r->S).r[3];
  iVar12 = (r->S).r[4];
  do {
    iVar11 = iVar10;
    iVar10 = iVar13;
    iVar13 = iVar15;
    iVar15 = (int)uVar8;
    (r->S).r[4] = iVar11;
    (r->S).r[3] = iVar10;
    uVar8 = (long)iVar11 * (long)iVar4 + (long)iVar10 * (long)iVar3 +
            (long)iVar13 * (long)iVar2 + (long)iVar15 * (long)iVar1;
    uVar7 = uVar8 + 0x8000b0e1c2e43c3e;
    if (uVar8 < 0x7fff4f1e3d1bc3c2) {
      uVar7 = uVar8;
    }
    (r->S).r[2] = iVar13;
    uVar7 = (long)iVar12 * (long)iVar5 + uVar7;
    uVar7 = (uVar7 >> 0x1f) * -0x7fffa78f + uVar7;
    uVar7 = (uVar7 >> 0x1f) * -0x7fffa78f + uVar7;
    uVar8 = uVar7 + 0x80005871;
    if (uVar7 < 0x7fffa78f) {
      uVar8 = uVar7;
    }
    (r->S).r[1] = iVar15;
    iVar16 = (int)uVar8;
    (r->S).r[0] = iVar16;
    iVar12 = 0;
    if (iVar16 != 0) {
      uVar7 = ((ulong)*(uint *)(trng::yarn5s::g + (uVar8 & 0xffff) * 4) *
               (ulong)*(uint *)(trng::yarn5s::g + (long)(iVar16 >> 0x10) * 4 + 0x40000) >> 0x1f) *
              -0x7fffa78f +
              (ulong)*(uint *)(trng::yarn5s::g + (uVar8 & 0xffff) * 4) *
              (ulong)*(uint *)(trng::yarn5s::g + (long)(iVar16 >> 0x10) * 4 + 0x40000);
      uVar7 = (uVar7 >> 0x1f) * -0x7fffa78f + uVar7;
      iVar16 = (int)uVar7;
      iVar12 = iVar16 + -0x7fffa78f;
      if (uVar7 < 0x7fffa78f) {
        iVar12 = iVar16;
      }
    }
    iVar9 = iVar9 + iVar12;
    lVar14 = lVar14 + -1;
    iVar12 = iVar11;
  } while (lVar14 != 0);
  lVar14 = std::chrono::_V2::system_clock::now();
  local_38 = 16.777216 / ((double)((lVar14 - lVar6) / 1000) * 1e-06);
  to_string<double>(&local_58,&local_38);
  while (local_58._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_58);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_58._M_dataplus._M_p,local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return iVar9;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}